

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit.cpp
# Opt level: O1

void __thiscall QTextEdit::timerEvent(QTextEdit *this,QTimerEvent *e)

{
  long lVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  QWidget *parent;
  QPoint QVar5;
  undefined8 uVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  ulong uVar15;
  long in_FS_OFFSET;
  QArrayData *local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  double local_c8;
  double dStack_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  double dStack_a0;
  QMouseEvent ev;
  QPoint globalPos;
  QPoint pos;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)&(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
  if (*(int *)(e + 0x10) == *(int *)(lVar2 + 0x308)) {
    lVar10 = *(long *)(*(long *)(lVar2 + 0x2b0) + 0x20);
    uVar13 = *(int *)(lVar10 + 0x1c) - *(int *)(lVar10 + 0x14);
    uVar12 = *(int *)(lVar10 + 0x20) - *(int *)(lVar10 + 0x18);
    pos.xp.m_i = 0;
    pos.yp.m_i = 0;
    if ((*(byte *)(lVar2 + 800) & 8) == 0) {
      globalPos = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
      globalPos = (QPoint)QCursor::pos();
      pos = QWidget::mapFromGlobal(*(QWidget **)(lVar2 + 0x2b0),&globalPos);
      _ev = &DAT_aaaaaaaaaaaaaaaa;
      local_a8 = (double)pos.xp.m_i.m_i;
      dStack_a0 = (double)pos.yp.m_i.m_i;
      parent = QWidget::window((QWidget *)this);
      QVar5 = QWidget::mapTo((QWidget *)this,parent,&pos);
      local_b8 = (double)QVar5.xp.m_i.m_i;
      local_b0 = (double)QVar5.yp.m_i.m_i;
      local_c8 = (double)globalPos.xp.m_i.m_i;
      dStack_c0 = (double)globalPos.yp.m_i.m_i;
      local_e8 = (QArrayData *)0x0;
      uStack_e0 = 0;
      local_d8 = 0;
      uVar6 = QPointingDevice::primaryPointingDevice((QString *)&local_e8);
      QMouseEvent::QMouseEvent(&ev,5,&local_a8,&local_b8,&local_c8,1,1,0,uVar6);
      if (local_e8 != (QArrayData *)0x0) {
        LOCK();
        (local_e8->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_e8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_e8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_e8,2,0x10);
        }
      }
      (**(code **)(*(long *)&(this->super_QAbstractScrollArea).super_QFrame.super_QWidget + 0xb0))
                (this,&ev);
      QMouseEvent::~QMouseEvent(&ev);
      uVar15 = 0;
    }
    else {
      uVar3 = (int)(uVar13 + 1) / 3;
      uVar7 = (ulong)uVar3;
      if (0x13 < (int)uVar3) {
        uVar7 = 0x14;
      }
      uVar3 = (int)(uVar12 + 1) / 3;
      pos = *(QPoint *)(lVar2 + 0x30c);
      if (0x13 < (int)uVar3) {
        uVar3 = 0x14;
      }
      uVar12 = uVar12 - uVar3;
      uVar15 = (ulong)uVar3 << 0x20 | uVar7;
      uVar13 = uVar13 - (int)uVar7;
    }
    iVar11 = (int)(uVar15 >> 0x20);
    iVar8 = pos.yp.m_i - iVar11;
    if (iVar8 <= (int)(uVar12 - pos.yp.m_i)) {
      iVar8 = uVar12 - pos.yp.m_i;
    }
    iVar8 = ~uVar12 + iVar11 + iVar8;
    iVar14 = (int)uVar15;
    iVar11 = pos.xp.m_i - iVar14;
    if (pos.xp.m_i - iVar14 <= (int)(uVar13 - pos.xp.m_i)) {
      iVar11 = uVar13 - pos.xp.m_i;
    }
    iVar11 = ~uVar13 + iVar14 + iVar11;
    iVar4 = iVar8;
    if (iVar8 < iVar11) {
      iVar4 = iVar11;
    }
    if (-1 < iVar4) {
      iVar9 = 7;
      if (7 < iVar4) {
        iVar9 = iVar4;
      }
      QBasicTimer::start(lVar2 + 0x308,(0x1324 / (ulong)(uint)(iVar9 * iVar9)) * 1000000,1,this);
      if (0 < iVar8) {
        lVar10 = (long)(int)uVar12 + ((long)uVar15 >> 0x20);
        QAbstractSlider::triggerAction
                  (*(QAbstractSlider **)(lVar2 + 0x290),
                   (pos.yp.m_i < (int)((ulong)(lVar10 - (lVar10 >> 0x3f)) >> 1)) +
                   SliderSingleStepAdd);
      }
      if (0 < iVar11) {
        QAbstractSlider::triggerAction
                  (*(QAbstractSlider **)(lVar2 + 0x288),
                   (pos.xp.m_i <
                   (int)((ulong)(((long)(int)uVar13 + (long)iVar14) -
                                ((long)(int)uVar13 + (long)iVar14 >> 0x3f)) >> 1)) +
                   SliderSingleStepAdd);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextEdit::timerEvent(QTimerEvent *e)
{
    Q_D(QTextEdit);
    if (e->timerId() == d->autoScrollTimer.timerId()) {
        QRect visible = d->viewport->rect();
        QPoint pos;
        if (d->inDrag) {
            pos = d->autoScrollDragPos;
            visible.adjust(qMin(visible.width()/3,20), qMin(visible.height()/3,20),
                           -qMin(visible.width()/3,20), -qMin(visible.height()/3,20));
        } else {
            const QPoint globalPos = QCursor::pos();
            pos = d->viewport->mapFromGlobal(globalPos);
            QMouseEvent ev(QEvent::MouseMove, pos, mapTo(topLevelWidget(), pos), globalPos, Qt::LeftButton, Qt::LeftButton, Qt::NoModifier);
            mouseMoveEvent(&ev);
        }
        int deltaY = qMax(pos.y() - visible.top(), visible.bottom() - pos.y()) - visible.height();
        int deltaX = qMax(pos.x() - visible.left(), visible.right() - pos.x()) - visible.width();
        int delta = qMax(deltaX, deltaY);
        if (delta >= 0) {
            if (delta < 7)
                delta = 7;
            int timeout = 4900 / (delta * delta);
            d->autoScrollTimer.start(timeout, this);

            if (deltaY > 0)
                d->vbar->triggerAction(pos.y() < visible.center().y() ?
                                       QAbstractSlider::SliderSingleStepSub
                                       : QAbstractSlider::SliderSingleStepAdd);
            if (deltaX > 0)
                d->hbar->triggerAction(pos.x() < visible.center().x() ?
                                       QAbstractSlider::SliderSingleStepSub
                                       : QAbstractSlider::SliderSingleStepAdd);
        }
    }
#ifdef QT_KEYPAD_NAVIGATION
    else if (e->timerId() == d->deleteAllTimer.timerId()) {
        d->deleteAllTimer.stop();
        clear();
    }
#endif
}